

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,quath *value)

{
  bool bVar1;
  half4 v;
  half4 local_10;
  
  bVar1 = ReadBasicType(this,&local_10);
  if (bVar1) {
    (value->real).value = local_10._M_elems[0].value;
    (value->imag)._M_elems[0].value = local_10._M_elems[1].value;
    (value->imag)._M_elems[1].value = local_10._M_elems[2].value;
    (value->imag)._M_elems[2].value = local_10._M_elems[3].value;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::quath *value) {
  value::half4 v;
  if (ReadBasicType(&v)) {
    value->real = v[0];
    value->imag[0] = v[1];
    value->imag[1] = v[2];
    value->imag[2] = v[3];
    return true;
  }
  return false;
}